

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall
ByteCodeGenerator::InitBlockScopedNonTemps
          (ByteCodeGenerator *this,ParseNode *pnode,FuncInfo *funcInfo)

{
  ByteCodeWriter *this_00;
  OpCode OVar1;
  RegSlot RVar2;
  Scope *this_01;
  Symbol *pSVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  ParseNodeBlock *pPVar7;
  ParseNodeVar *pPVar8;
  ParseNodeCatch *pPVar9;
  ParseNodeFnc *pPVar10;
  ParseNodeWith *pPVar11;
  ParseNodePtr *ppPVar12;
  ParseNodePtr this_02;
  
  if (pnode != (ParseNode *)0x0) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    this_00 = &this->m_writer;
    do {
      OVar1 = pnode->nop;
      if (OVar1 < knopWith) {
        if (OVar1 == knopFncDecl) {
          pPVar10 = ParseNode::AsParseNodeFnc(pnode);
          if (pPVar10->pnodeName != (ParseNodeVar *)0x0 &&
              (pPVar10->fncFlags & kFunctionIsMethod) == kFunctionNone) {
            pSVar3 = pPVar10->pnodeName->sym;
            if (pSVar3 == (Symbol *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar6 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x5e4,"(sym)","sym");
              if (!bVar5) goto LAB_0080e172;
              *puVar6 = 0;
            }
            if (((pSVar3->location != 0xffffffff) &&
                (bVar5 = Scope::IsBlockScope(pSVar3->scope,funcInfo), bVar5)) &&
               (pSVar3->scope->func == funcInfo)) {
              Js::ByteCodeWriter::Reg1(this_00,LdUndef,pSVar3->location);
            }
          }
          ppPVar12 = &pPVar10->pnodeNext;
        }
        else {
          if (OVar1 != knopBlock) {
LAB_0080e113:
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar6 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x61f,"(false)","false");
            if (bVar5) {
              *puVar6 = 0;
              return;
            }
LAB_0080e172:
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          pPVar7 = ParseNode::AsParseNodeBlock(pnode);
          this_01 = pPVar7->scope;
          if (this_01 != (Scope *)0x0) {
            bVar5 = Scope::IsBlockScope(this_01,funcInfo);
            if (((bVar5) && (RVar2 = this_01->location, RVar2 != 0xffffffff)) &&
               (bVar5 = FuncInfo::IsTmpReg(funcInfo,RVar2), !bVar5)) {
              Js::ByteCodeWriter::Reg1(this_00,LdUndef,RVar2);
            }
            if ((pPVar7->super_ParseNodeStmt).super_ParseNode.nop != knopBlock) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar6 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeGenerator.h"
                                 ,0x1ef,"(pnodeBlock->nop == knopBlock)",
                                 "pnodeBlock->nop == knopBlock");
              if (!bVar5) goto LAB_0080e172;
              *puVar6 = 0;
            }
            this_02 = pPVar7->pnodeLexVars;
            while (this_02 != (ParseNode *)0x0) {
              pPVar8 = ParseNode::AsParseNodeVar(this_02);
              pSVar3 = pPVar8->sym;
              bVar5 = Symbol::IsInSlot(pSVar3,this,funcInfo,false);
              if ((!bVar5) && ((*(ushort *)&pSVar3->field_0x42 & 0x8008) == 0)) {
                pPVar8 = ParseNode::AsParseNodeVar(this_02);
                Js::ByteCodeWriter::Reg1(this_00,InitUndecl,pPVar8->sym->location);
              }
              pPVar8 = ParseNode::AsParseNodeVar(this_02);
              this_02 = pPVar8->pnodeNext;
            }
          }
          InitBlockScopedNonTemps(this,pPVar7->pnodeScopes,funcInfo);
          ppPVar12 = &pPVar7->pnodeNext;
        }
      }
      else if (OVar1 == knopWith) {
        RVar2 = pnode->location;
        if ((RVar2 == 0xffffffff) || (bVar5 = FuncInfo::IsTmpReg(funcInfo,RVar2), bVar5)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x617,
                             "(withLoc != Js::Constants::NoRegister && !funcInfo->IsTmpReg(withLoc))"
                             ,"We should put with objects at known stack locations in debug mode");
          if (!bVar5) goto LAB_0080e172;
          *puVar6 = 0;
        }
        Js::ByteCodeWriter::Reg1(this_00,LdUndef,RVar2);
        pPVar11 = ParseNode::AsParseNodeWith(pnode);
        InitBlockScopedNonTemps(this,pPVar11->pnodeScopes,funcInfo);
        pPVar11 = ParseNode::AsParseNodeWith(pnode);
        ppPVar12 = &pPVar11->pnodeNext;
      }
      else {
        if (OVar1 != knopCatch) goto LAB_0080e113;
        pPVar9 = ParseNode::AsParseNodeCatch(pnode);
        InitBlockScopedNonTemps(this,pPVar9->pnodeScopes,funcInfo);
        pPVar9 = ParseNode::AsParseNodeCatch(pnode);
        ppPVar12 = &pPVar9->pnodeNext;
      }
      pnode = *ppPVar12;
    } while (pnode != (ParseNodePtr)0x0);
  }
  return;
}

Assistant:

void ByteCodeGenerator::InitBlockScopedNonTemps(ParseNode *pnode, FuncInfo *funcInfo)
{
    // Initialize all non-temp register variables on entry to the enclosing func - in particular,
    // those with lifetimes that begin after the start of user code and may not be initialized normally.
    // This protects us from, for instance, trying to restore garbage on bailout.
    // It was originally done in debugger mode only, but we do it always to avoid issues with boxing
    // garbage on exit from jitted loop bodies.
    while (pnode)
    {
        switch (pnode->nop)
        {
        case knopFncDecl:
        {
            // If this is a block-scoped function, initialize it.
            ParseNodeFnc * pnodeFnc = pnode->AsParseNodeFnc();
            ParseNodeVar *pnodeName = pnodeFnc->pnodeName;
            if (!pnodeFnc->IsMethod() && pnodeName != nullptr)
            {
                Symbol *sym = pnodeName->sym;
                Assert(sym);
                if (sym->GetLocation() != Js::Constants::NoRegister &&
                    sym->GetScope()->IsBlockScope(funcInfo) &&
                    sym->GetScope()->GetFunc() == funcInfo)
                {
                    this->m_writer.Reg1(Js::OpCode::LdUndef, sym->GetLocation());
                }
            }

            // No need to recurse to the nested scopes, as they belong to a nested function.
            pnode = pnodeFnc->pnodeNext;
            break;
        }

        case knopBlock:
        {
            ParseNodeBlock * pnodeBlock = pnode->AsParseNodeBlock();
            Scope *scope = pnodeBlock->scope;
            if (scope)
            {
                if (scope->IsBlockScope(funcInfo))
                {
                    Js::RegSlot scopeLoc = scope->GetLocation();
                    if (scopeLoc != Js::Constants::NoRegister && !funcInfo->IsTmpReg(scopeLoc))
                    {
                        this->m_writer.Reg1(Js::OpCode::LdUndef, scopeLoc);
                    }
                }
                auto fnInit = [this, funcInfo](ParseNode *pnode)
                {
                    Symbol *sym = pnode->AsParseNodeVar()->sym;
                    if (!sym->IsInSlot(this, funcInfo) && !sym->GetIsGlobal() && !sym->GetIsModuleImport())
                    {
                        this->m_writer.Reg1(Js::OpCode::InitUndecl, pnode->AsParseNodeVar()->sym->GetLocation());
                    }
                };
                IterateBlockScopedVariables(pnodeBlock, fnInit);
            }
            InitBlockScopedNonTemps(pnodeBlock->pnodeScopes, funcInfo);
            pnode = pnodeBlock->pnodeNext;
            break;
        }
        case knopCatch:
            InitBlockScopedNonTemps(pnode->AsParseNodeCatch()->pnodeScopes, funcInfo);
            pnode = pnode->AsParseNodeCatch()->pnodeNext;
            break;

        case knopWith:
        {
            Js::RegSlot withLoc = pnode->location;
            AssertMsg(withLoc != Js::Constants::NoRegister && !funcInfo->IsTmpReg(withLoc),
                "We should put with objects at known stack locations in debug mode");
            this->m_writer.Reg1(Js::OpCode::LdUndef, withLoc);
            InitBlockScopedNonTemps(pnode->AsParseNodeWith()->pnodeScopes, funcInfo);
            pnode = pnode->AsParseNodeWith()->pnodeNext;
            break;
        }

        default:
            Assert(false);
            return;
        }
    }
}